

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  undefined8 uVar1;
  ulong nbCols;
  undefined1 auVar2 [16];
  long lVar3;
  undefined8 *puVar4;
  Index index;
  ulong uVar5;
  long lVar6;
  
  uVar5 = *(ulong *)other;
  nbCols = *(ulong *)(other + 8);
  if ((nbCols != 0 && uVar5 != 0) &&
     (auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar2 / SEXT816((long)nbCols),0) < (long)uVar5)) {
    puVar4 = (undefined8 *)
             __cxa_allocate_exception(8,other,SUB168(auVar2 % SEXT816((long)nbCols),0));
    *puVar4 = std::streambuf::xsgetn;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((long)(nbCols | uVar5) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * uVar5,uVar5,nbCols);
  if ((*(long *)(this + 8) == *(long *)other) && (*(long *)(this + 0x10) == *(long *)(other + 8))) {
    lVar3 = *(long *)(this + 0x10) * *(long *)(this + 8);
    uVar5 = lVar3 - (lVar3 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar3) {
      lVar6 = 0;
      do {
        uVar1 = *(undefined8 *)(other + 0x10);
        puVar4 = (undefined8 *)(*(long *)this + lVar6 * 8);
        *puVar4 = uVar1;
        puVar4[1] = uVar1;
        lVar6 = lVar6 + 2;
      } while (lVar6 < (long)uVar5);
    }
    if ((long)uVar5 < lVar3) {
      lVar6 = *(long *)this;
      uVar1 = *(undefined8 *)(other + 0x10);
      do {
        *(undefined8 *)(lVar6 + uVar5 * 8) = uVar1;
        uVar5 = uVar5 + 1;
      } while (lVar3 - uVar5 != 0);
    }
    return (Matrix<double,__1,__1,_0,__1,__1> *)this;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                ,0x1f2,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }